

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

String __thiscall doctest::detail::rawMemoryToString(detail *this,void *object,uint size)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  ostringstream os;
  undefined1 auStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0x",2);
  lVar2 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar2 + 1] == '\0') {
    cVar1 = std::ios::widen((char)auStack_1c8 + (char)lVar2 + '(');
    acStack_c0[lVar2] = cVar1;
    acStack_c0[lVar2 + 1] = '\x01';
  }
  acStack_c0[lVar2] = '0';
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  lVar2 = (long)(int)size;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__cxx11::stringbuf::str();
  String::String((String *)this,(char *)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return (String)(char *)this;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned char const* bytes = static_cast<unsigned char const*>(object);
        std::ostringstream   os;
        os << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            os << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return os.str().c_str();
    }